

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_free.c
# Opt level: O0

void lyplg_ext_cfree_instance_substatements(ly_ctx *ctx,lysc_ext_substmt *substmts)

{
  ushort uVar1;
  ly_stmt lVar2;
  lysc_node *plVar3;
  void *pvVar4;
  ulong local_128;
  lysc_ext_instance *local_118;
  lysc_type *local_108;
  lysc_pattern **local_f8;
  lysc_range *local_e8;
  lyd_node **local_d0;
  ulong local_c0;
  uint64_t c___4;
  lysc_ext_instance *exts;
  uint64_t c___3;
  lysc_ident *idents;
  lysc_type *type;
  uint64_t c___2;
  lysc_pattern **patterns;
  uint64_t c___1;
  lysc_must *musts;
  lysc_range *range;
  uint64_t c__;
  lysc_type_bitenum_item *items;
  char *str;
  lysc_node *child_next;
  lysc_node *child;
  undefined1 auStack_40 [7];
  ly_bool node_free;
  lysf_ctx fctx;
  uint64_t u;
  lysc_ext_substmt *substmts_local;
  ly_ctx *ctx_local;
  
  memset(auStack_40,0,0x20);
  fctx.ext_set.field_2.dnodes = (lyd_node **)0x0;
  _auStack_40 = ctx;
  do {
    if (substmts == (lysc_ext_substmt *)0x0) {
      local_d0 = (lyd_node **)0x0;
    }
    else {
      local_d0 = (lyd_node **)substmts[-1].storage_p;
    }
    if (local_d0 <= fctx.ext_set.field_2.dnodes) {
      if (substmts != (lysc_ext_substmt *)0x0) {
        free(&substmts[-1].storage_p);
      }
      return;
    }
    if (substmts[(long)fctx.ext_set.field_2].storage_p != (void **)0x0) {
      lVar2 = substmts[(long)fctx.ext_set.field_2].stmt;
      if (((((lVar2 - LY_STMT_NOTIFICATION < 2) || (lVar2 == LY_STMT_OUTPUT)) ||
           (lVar2 == LY_STMT_ACTION)) || ((lVar2 == LY_STMT_RPC || (lVar2 == LY_STMT_ANYDATA)))) ||
         (lVar2 == LY_STMT_ANYXML)) {
LAB_0019b707:
        plVar3 = (lysc_node *)*substmts[(long)fctx.ext_set.field_2].storage_p;
        while (child_next = plVar3, child_next != (lysc_node *)0x0) {
          plVar3 = child_next->next;
          uVar1 = child_next->nodetype;
          lysc_node_free_((lysf_ctx *)auStack_40,child_next);
          if ((uVar1 & 0x3000) != 0) {
            free(child_next);
          }
        }
        *substmts[(long)fctx.ext_set.field_2].storage_p = (void *)0x0;
      }
      else if (lVar2 != LY_STMT_AUGMENT) {
        if (((lVar2 == LY_STMT_CASE) || (lVar2 == LY_STMT_CHOICE)) || (lVar2 == LY_STMT_CONTAINER))
        goto LAB_0019b707;
        if (lVar2 != LY_STMT_GROUPING) {
          if (((lVar2 == LY_STMT_LEAF) || (lVar2 == LY_STMT_LEAF_LIST)) || (lVar2 == LY_STMT_LIST))
          goto LAB_0019b707;
          if (lVar2 != LY_STMT_USES) {
            if (lVar2 == LY_STMT_ARGUMENT) goto LAB_0019b7bf;
            if ((lVar2 != LY_STMT_BASE) && (lVar2 != LY_STMT_BELONGS_TO)) {
              if (lVar2 == LY_STMT_BIT) {
LAB_0019b7eb:
                pvVar4 = *substmts[(long)fctx.ext_set.field_2].storage_p;
                range = (lysc_range *)0x0;
                while( true ) {
                  if (pvVar4 == (void *)0x0) {
                    local_e8 = (lysc_range *)0x0;
                  }
                  else {
                    local_e8 = *(lysc_range **)((long)pvVar4 + -8);
                  }
                  if (local_e8 <= range) break;
                  lysc_enum_item_free((lysf_ctx *)auStack_40,
                                      (lysc_type_bitenum_item *)((long)pvVar4 + (long)range * 0x28))
                  ;
                  range = (lysc_range *)((long)&range->parts + 1);
                }
                if (pvVar4 != (void *)0x0) {
                  free((void *)((long)pvVar4 + -8));
                }
              }
              else if (lVar2 != LY_STMT_CONFIG) {
                if (lVar2 == LY_STMT_CONTACT) {
LAB_0019b7bf:
                  lydict_remove(ctx,(char *)*substmts[(long)fctx.ext_set.field_2].storage_p);
                }
                else if (lVar2 != LY_STMT_DEFAULT) {
                  if (lVar2 == LY_STMT_DESCRIPTION) goto LAB_0019b7bf;
                  if ((lVar2 != LY_STMT_DEVIATE) && (lVar2 != LY_STMT_DEVIATION)) {
                    if (lVar2 == LY_STMT_ENUM) goto LAB_0019b7eb;
                    if ((lVar2 == LY_STMT_ERROR_APP_TAG) || (lVar2 == LY_STMT_ERROR_MESSAGE))
                    goto LAB_0019b7bf;
                    if (lVar2 != LY_STMT_EXTENSION) {
                      if (lVar2 == LY_STMT_EXTENSION_INSTANCE) {
                        pvVar4 = *substmts[(long)fctx.ext_set.field_2].storage_p;
                        local_c0 = 0;
                        while( true ) {
                          if (pvVar4 == (void *)0x0) {
                            local_128 = 0;
                          }
                          else {
                            local_128 = *(ulong *)((long)pvVar4 + -8);
                          }
                          if (local_128 <= local_c0) break;
                          lysc_ext_instance_free
                                    ((lysf_ctx *)auStack_40,
                                     (lysc_ext_instance *)((long)pvVar4 + local_c0 * 0x48));
                          local_c0 = local_c0 + 1;
                        }
                        if (pvVar4 != (void *)0x0) {
                          free((void *)((long)pvVar4 + -8));
                        }
                      }
                      else if ((lVar2 != LY_STMT_FEATURE) && (lVar2 != LY_STMT_FRACTION_DIGITS)) {
                        if (lVar2 == LY_STMT_IDENTITY) {
                          pvVar4 = *substmts[(long)fctx.ext_set.field_2].storage_p;
                          exts = (lysc_ext_instance *)0x0;
                          while( true ) {
                            if (pvVar4 == (void *)0x0) {
                              local_118 = (lysc_ext_instance *)0x0;
                            }
                            else {
                              local_118 = *(lysc_ext_instance **)((long)pvVar4 + -8);
                            }
                            if (local_118 <= exts) break;
                            lysc_ident_free((lysf_ctx *)auStack_40,
                                            (lysc_ident *)((long)pvVar4 + (long)exts * 0x38));
                            exts = (lysc_ext_instance *)((long)&exts->def + 1);
                          }
                          if (pvVar4 != (void *)0x0) {
                            free((void *)((long)pvVar4 + -8));
                          }
                        }
                        else if (((lVar2 != LY_STMT_IF_FEATURE) && (lVar2 != LY_STMT_IMPORT)) &&
                                (lVar2 != LY_STMT_INCLUDE)) {
                          if (lVar2 == LY_STMT_KEY) goto LAB_0019b7bf;
                          if (lVar2 == LY_STMT_LENGTH) {
LAB_0019b88a:
                            lysc_range_free((lysf_ctx *)auStack_40,
                                            (lysc_range *)
                                            *substmts[(long)fctx.ext_set.field_2].storage_p);
                          }
                          else if (((lVar2 != LY_STMT_MANDATORY) && (lVar2 != LY_STMT_MAX_ELEMENTS))
                                  && (lVar2 != LY_STMT_MIN_ELEMENTS)) {
                            if (lVar2 == LY_STMT_MODIFIER) goto LAB_0019b7bf;
                            if (lVar2 != LY_STMT_MODULE) {
                              if (lVar2 == LY_STMT_MUST) {
                                pvVar4 = *substmts[(long)fctx.ext_set.field_2].storage_p;
                                patterns = (lysc_pattern **)0x0;
                                while( true ) {
                                  if (pvVar4 == (void *)0x0) {
                                    local_f8 = (lysc_pattern **)0x0;
                                  }
                                  else {
                                    local_f8 = *(lysc_pattern ***)((long)pvVar4 + -8);
                                  }
                                  if (local_f8 <= patterns) break;
                                  lysc_must_free((lysf_ctx *)auStack_40,
                                                 (lysc_must *)((long)pvVar4 + (long)patterns * 0x38)
                                                );
                                  patterns = (lysc_pattern **)((long)patterns + 1);
                                }
                                if (pvVar4 != (void *)0x0) {
                                  free((void *)((long)pvVar4 + -8));
                                }
                              }
                              else {
                                if (lVar2 == LY_STMT_NAMESPACE) goto LAB_0019b7bf;
                                if (lVar2 != LY_STMT_ORDERED_BY) {
                                  if (lVar2 == LY_STMT_ORGANIZATION) goto LAB_0019b7bf;
                                  if (lVar2 != LY_STMT_PATH) {
                                    if (lVar2 == LY_STMT_PATTERN) {
                                      pvVar4 = *substmts[(long)fctx.ext_set.field_2].storage_p;
                                      type = (lysc_type *)0x0;
                                      while( true ) {
                                        if (pvVar4 == (void *)0x0) {
                                          local_108 = (lysc_type *)0x0;
                                        }
                                        else {
                                          local_108 = *(lysc_type **)((long)pvVar4 + -8);
                                        }
                                        if (local_108 <= type) break;
                                        lysc_pattern_free((lysf_ctx *)auStack_40,
                                                          (lysc_pattern **)
                                                          ((long)pvVar4 + (long)type * 8));
                                        type = (lysc_type *)((long)&type->name + 1);
                                      }
                                      if (pvVar4 != (void *)0x0) {
                                        free((void *)((long)pvVar4 + -8));
                                      }
                                    }
                                    else if ((lVar2 != LY_STMT_POSITION) &&
                                            (lVar2 != LY_STMT_PREFIX)) {
                                      if (lVar2 != LY_STMT_PRESENCE) {
                                        if (lVar2 == LY_STMT_RANGE) goto LAB_0019b88a;
                                        if (lVar2 != LY_STMT_REFERENCE) {
                                          if (((((lVar2 != LY_STMT_REFINE) &&
                                                (lVar2 != LY_STMT_REQUIRE_INSTANCE)) &&
                                               (lVar2 != LY_STMT_REVISION)) &&
                                              ((lVar2 != LY_STMT_REVISION_DATE &&
                                               (lVar2 != LY_STMT_STATUS)))) &&
                                             (lVar2 != LY_STMT_SUBMODULE)) {
                                            if (lVar2 == LY_STMT_TYPE) {
                                              lysc_type_free((lysf_ctx *)auStack_40,
                                                             (lysc_type *)
                                                             *substmts[(long)fctx.ext_set.field_2].
                                                              storage_p);
                                            }
                                            else if ((lVar2 != LY_STMT_TYPEDEF) &&
                                                    (lVar2 != LY_STMT_UNIQUE)) {
                                              if (lVar2 == LY_STMT_UNITS) goto LAB_0019b7bf;
                                              if (lVar2 != LY_STMT_VALUE) {
                                                if (lVar2 == LY_STMT_WHEN) {
                                                  lysc_when_free((lysf_ctx *)auStack_40,
                                                                 (lysc_when **)
                                                                 substmts[(long)fctx.ext_set.field_2
                                                                         ].storage_p);
                                                }
                                                else if ((lVar2 != LY_STMT_YANG_VERSION) &&
                                                        (lVar2 != LY_STMT_YIN_ELEMENT)) {
                                                  ly_log(ctx,LY_LLERR,LY_EINT,
                                                         "Internal error (%s:%d).",
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_schema_free.c"
                                                  ,0x6a2);
                                                }
                                              }
                                            }
                                          }
                                          goto LAB_0019bc12;
                                        }
                                      }
                                      goto LAB_0019b7bf;
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
LAB_0019bc12:
    fctx.ext_set.field_2.dnodes = fctx.ext_set.field_2.dnodes + 1;
  } while( true );
}

Assistant:

LIBYANG_API_DEF void
lyplg_ext_cfree_instance_substatements(const struct ly_ctx *ctx, struct lysc_ext_substmt *substmts)
{
    LY_ARRAY_COUNT_TYPE u;
    struct lysf_ctx fctx = {.ctx = (struct ly_ctx *)ctx};
    ly_bool node_free;

    LY_ARRAY_FOR(substmts, u) {
        if (!substmts[u].storage_p) {
            continue;
        }

        switch (substmts[u].stmt) {
        case LY_STMT_NOTIFICATION:
        case LY_STMT_INPUT:
        case LY_STMT_OUTPUT:
        case LY_STMT_ACTION:
        case LY_STMT_RPC:
        case LY_STMT_ANYDATA:
        case LY_STMT_ANYXML:
        case LY_STMT_CASE:
        case LY_STMT_CHOICE:
        case LY_STMT_CONTAINER:
        case LY_STMT_LEAF:
        case LY_STMT_LEAF_LIST:
        case LY_STMT_LIST: {
            struct lysc_node *child, *child_next;

            LY_LIST_FOR_SAFE(*substmts[u].storage_p, child_next, child) {
                node_free = (child->nodetype & (LYS_INPUT | LYS_OUTPUT)) ? 1 : 0;
                lysc_node_free_(&fctx, child);
                if (node_free) {
                    free(child);
                }
            }
            *substmts[u].storage_p = NULL;
            break;
        }
        case LY_STMT_USES:
        case LY_STMT_CONFIG:
        case LY_STMT_FRACTION_DIGITS:
        case LY_STMT_MANDATORY:
        case LY_STMT_MAX_ELEMENTS:
        case LY_STMT_MIN_ELEMENTS:
        case LY_STMT_ORDERED_BY:
        case LY_STMT_POSITION:
        case LY_STMT_REQUIRE_INSTANCE:
        case LY_STMT_STATUS:
        case LY_STMT_VALUE:
            /* nothing to do */
            break;

        case LY_STMT_ARGUMENT:
        case LY_STMT_CONTACT:
        case LY_STMT_DESCRIPTION:
        case LY_STMT_ERROR_APP_TAG:
        case LY_STMT_ERROR_MESSAGE:
        case LY_STMT_KEY:
        case LY_STMT_MODIFIER:
        case LY_STMT_NAMESPACE:
        case LY_STMT_ORGANIZATION:
        case LY_STMT_PRESENCE:
        case LY_STMT_REFERENCE:
        case LY_STMT_UNITS: {
            /* single item */
            const char *str = *substmts[u].storage_p;

            lydict_remove(ctx, str);
            break;
        }
        case LY_STMT_BIT:
        case LY_STMT_ENUM: {
            /* sized array */
            struct lysc_type_bitenum_item *items = *substmts[u].storage_p;

            FREE_ARRAY(&fctx, items, lysc_enum_item_free);
            break;
        }
        case LY_STMT_LENGTH:
        case LY_STMT_RANGE: {
            /* single item */
            struct lysc_range *range = *substmts[u].storage_p;

            lysc_range_free(&fctx, range);
            break;
        }
        case LY_STMT_MUST: {
            /* sized array */
            struct lysc_must *musts = *substmts[u].storage_p;

            FREE_ARRAY(&fctx, musts, lysc_must_free);
            break;
        }
        case LY_STMT_WHEN:
            /* single item, expects a pointer */
            lysc_when_free(&fctx, (struct lysc_when **)substmts[u].storage_p);
            break;

        case LY_STMT_PATTERN: {
            /* sized array of pointers */
            struct lysc_pattern **patterns = *substmts[u].storage_p;

            FREE_ARRAY(&fctx, patterns, lysc_pattern_free);
            break;
        }
        case LY_STMT_TYPE: {
            /* single item */
            struct lysc_type *type = *substmts[u].storage_p;

            lysc_type_free(&fctx, type);
            break;
        }
        case LY_STMT_IDENTITY: {
            /* sized array */
            struct lysc_ident *idents = *substmts[u].storage_p;

            FREE_ARRAY(&fctx, idents, lysc_ident_free);
            break;
        }
        case LY_STMT_EXTENSION_INSTANCE: {
            /* sized array */
            struct lysc_ext_instance *exts = *substmts[u].storage_p;

            FREE_ARRAY(&fctx, exts, lysc_ext_instance_free);
            break;
        }
        case LY_STMT_AUGMENT:
        case LY_STMT_BASE:
        case LY_STMT_BELONGS_TO:
        case LY_STMT_DEFAULT:
        case LY_STMT_DEVIATE:
        case LY_STMT_DEVIATION:
        case LY_STMT_EXTENSION:
        case LY_STMT_FEATURE:
        case LY_STMT_GROUPING:
        case LY_STMT_IF_FEATURE:
        case LY_STMT_IMPORT:
        case LY_STMT_INCLUDE:
        case LY_STMT_MODULE:
        case LY_STMT_PATH:
        case LY_STMT_PREFIX:
        case LY_STMT_REFINE:
        case LY_STMT_REVISION:
        case LY_STMT_REVISION_DATE:
        case LY_STMT_SUBMODULE:
        case LY_STMT_TYPEDEF:
        case LY_STMT_UNIQUE:
        case LY_STMT_YANG_VERSION:
        case LY_STMT_YIN_ELEMENT:
            /* it is not possible to compile these statements */
            break;

        default:
            LOGINT(ctx);
        }
    }

    LY_ARRAY_FREE(substmts);
}